

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O2

int linenoise::unicodePrevGraphemeLen(char *buf,int pos)

{
  int iVar1;
  int iVar2;
  int cp;
  int local_2c;
  
  iVar2 = 0;
  if (pos != 0) {
    iVar2 = pos;
    do {
      if (iVar2 < 1) {
        return 0;
      }
      iVar1 = unicodePrevUTF8CharLen(buf,iVar2);
      local_2c = 0;
      iVar2 = iVar2 - iVar1;
      unicodeUTF8CharToCodePoint(buf + iVar2,iVar1,&local_2c);
      iVar1 = unicodeIsCombiningChar((long)local_2c);
    } while (iVar1 != 0);
    iVar2 = pos - iVar2;
  }
  return iVar2;
}

Assistant:

inline int unicodePrevGraphemeLen(char* buf, int pos)
{
    if (pos == 0) {
        return 0;
    }
    int end = pos;
    while (pos > 0) {
        int len = unicodePrevUTF8CharLen(buf, pos);
        pos -= len;
        int cp = 0;
        unicodeUTF8CharToCodePoint(buf + pos, len, &cp);
        if (!unicodeIsCombiningChar(cp)) {
            return end - pos;
        }
    }
    return 0;
}